

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collimator.cpp
# Opt level: O2

int __thiscall imrt::Collimator::searchReferenceIndex(Collimator *this,pair<int,_int> p)

{
  int iVar1;
  undefined8 in_RAX;
  mapped_type *pmVar2;
  undefined8 uStack_38;
  
  iVar1 = 0;
  uStack_38 = in_RAX;
  while( true ) {
    uStack_38 = CONCAT44(iVar1,(undefined4)uStack_38);
    if (this->ref_size <= iVar1) {
      return -1;
    }
    pmVar2 = std::
             map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
             ::operator[](&this->reference,(key_type_conflict *)((long)&uStack_38 + 4));
    if ((pmVar2->first == p.first) &&
       (pmVar2 = std::
                 map<int,_std::pair<int,_int>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<int,_int>_>_>_>
                 ::operator[](&this->reference,(key_type_conflict *)((long)&uStack_38 + 4)),
       pmVar2->second == p.second)) break;
    iVar1 = uStack_38._4_4_ + 1;
  }
  return uStack_38._4_4_;
}

Assistant:

int Collimator::searchReferenceIndex (pair<int, int> p) {
    for (int i=0;i<ref_size;i++) {
      if (reference[i].first == p.first && reference[i].second==p.second)
        return(i);
    }
    return(-1);
  }